

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall Highs::changeCoeff(Highs *this,HighsInt row,HighsInt col,double value)

{
  uint uVar1;
  HighsStatus HVar2;
  ulong uVar3;
  char *format;
  
  if ((row < 0) || ((this->model_).lp_.num_row_ <= row)) {
    uVar1 = (this->model_).lp_.num_row_;
    format = "Row %d supplied to Highs::changeCoeff is not in the range [0, %d]\n";
    uVar3 = (ulong)(uint)row;
  }
  else {
    uVar1 = (this->model_).lp_.num_col_;
    if (-1 < col && col < (int)uVar1) {
      if (value != 0.0) {
        if (ABS(value) <= (this->options_).super_HighsOptionsStruct.small_matrix_value) {
          highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kWarning,
                       "|Value| of %g supplied to Highs::changeCoeff is in (0, %g]: zeroes any existing coefficient, otherwise ignored\n"
                      );
        }
      }
      changeCoefficientInterface(this,row,col,value);
      HVar2 = returnFromHighs(this,kOk);
      return HVar2;
    }
    format = "Col %d supplied to Highs::changeCoeff is not in the range [0, %d]\n";
    uVar3 = (ulong)(uint)col;
  }
  highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,format,uVar3,
               (ulong)uVar1);
  return kError;
}

Assistant:

HighsStatus Highs::changeCoeff(const HighsInt row, const HighsInt col,
                               const double value) {
  if (row < 0 || row >= model_.lp_.num_row_) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Row %" HIGHSINT_FORMAT
                 " supplied to Highs::changeCoeff is not in the range [0, "
                 "%" HIGHSINT_FORMAT "]\n",
                 row, model_.lp_.num_row_);
    return HighsStatus::kError;
  }
  if (col < 0 || col >= model_.lp_.num_col_) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Col %" HIGHSINT_FORMAT
                 " supplied to Highs::changeCoeff is not in the range [0, "
                 "%" HIGHSINT_FORMAT "]\n",
                 col, model_.lp_.num_col_);
    return HighsStatus::kError;
  }
  const double abs_value = std::fabs(value);
  if (0 < abs_value && abs_value <= options_.small_matrix_value) {
    highsLogUser(options_.log_options, HighsLogType::kWarning,
                 "|Value| of %g supplied to Highs::changeCoeff is in (0, %g]: "
                 "zeroes any existing coefficient, otherwise ignored\n",
                 abs_value, options_.small_matrix_value);
  }
  changeCoefficientInterface(row, col, value);
  return returnFromHighs(HighsStatus::kOk);
}